

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O2

ostream * sciplot::gnuplot::multiplotcmd(ostream *out,size_t rows,size_t columns,string *title)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,
                           "#=============================================================================="
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"# MULTIPLOT");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,
                           "#=============================================================================="
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"set multiplot");
  if (columns != 0 || rows != 0) {
    poVar1 = std::operator<<(out," layout ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,",");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  poVar1 = std::operator<<(out," ");
  std::operator<<(poVar1,"rowsfirst");
  poVar1 = std::operator<<(out," ");
  std::operator<<(poVar1,"downwards");
  if (title->_M_string_length != 0) {
    poVar1 = std::operator<<(out," title \"");
    poVar1 = std::operator<<(poVar1,(string *)title);
    std::operator<<(poVar1,"\"");
  }
  std::endl<char,std::char_traits<char>>(out);
  return out;
}

Assistant:

inline auto multiplotcmd(std::ostream& out, std::size_t rows, std::size_t columns, std::string title) -> std::ostream&
{
    out << "#==============================================================================" << std::endl;
    out << "# MULTIPLOT" << std::endl;
    out << "#==============================================================================" << std::endl;
    out << "set multiplot";
    if (rows != 0 || columns != 0)
    {
        out << " layout " << rows << "," << columns;
    }
    out << " " << "rowsfirst";
    out << " " << "downwards";
    if(!title.empty())
    {
        out << " title \"" << title << "\"";
    }
    out << std::endl;
    return out;
}